

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landb.hpp
# Opt level: O3

bool __thiscall lan::db::iterate<int>(db *this,string *target,int value,db_bit_type type)

{
  pointer pcVar1;
  db_bit *context;
  bool bVar2;
  db_bits *pdVar3;
  invalid_argument *this_00;
  _Alloc_hider _Var4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  pcVar1 = (target->_M_dataplus)._M_p;
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,pcVar1,pcVar1 + target->_M_string_length);
  pdVar3 = find_rec(this,&local_b0,Container,Array,this->first);
  this->data = pdVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if (pdVar3 != (db_bits *)0x0) {
    context = this->data;
    if (context->lin == (db_bit *)0x0) {
      paVar5 = &local_90.field_2;
      local_90._M_dataplus._M_p = (pointer)paVar5;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"");
      bVar2 = init_iter<int>(this,context,&local_90,value,type);
      _Var4._M_p = local_90._M_dataplus._M_p;
    }
    else {
      paVar5 = &local_70.field_2;
      local_70._M_dataplus._M_p = (pointer)paVar5;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
      bVar2 = append_iter<int>(this,context,&local_70,value,type);
      _Var4._M_p = local_70._M_dataplus._M_p;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var4._M_p != paVar5) {
      operator_delete(_Var4._M_p,paVar5->_M_allocated_capacity + 1);
    }
    return bVar2;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::operator+(&local_d0,target,"{a}");
  error_string(&local_50,this,_bit_name_error,&local_d0);
  std::invalid_argument::invalid_argument(this_00,(string *)&local_50);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

bool iterate(std::string const target, any const value, db_bit_type const type){
            if((data = find_rec(target, lan::Container, lan::Array, first))) {
                return (data->lin) ? append_iter(data, "", value, type) :
                init_iter(data, "", value, type);
            } throw lan::errors::bit_name_error(error_string(errors::_private::_bit_name_error, target+"{a}"));
        }